

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O2

int Gla_ManGetOutLit(Gla_Man_t *p,int f)

{
  int iVar1;
  Gla_Obj_t *pGVar2;
  Gla_Obj_t *pGVar3;
  
  pGVar2 = Gla_ManObj(p,p->pObjRoot->Fanins[0]);
  iVar1 = Vec_IntEntry(&pGVar2->vFrames,f);
  if (iVar1 < 1) {
    __assert_fail("iSat > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGlaOld.c"
                  ,0x5a0,"int Gla_ManGetOutLit(Gla_Man_t *, int)");
  }
  if (f == 0) {
    pGVar3 = p->pObjRoot;
    if (((pGVar2->field_0x4 & 0x20) != 0) && ((pGVar3->field_0x4 & 2) == 0)) {
      return -1;
    }
  }
  else {
    pGVar3 = p->pObjRoot;
  }
  return (*(uint *)&pGVar3->field_0x4 >> 1 & 1) + iVar1 * 2;
}

Assistant:

int Gla_ManGetOutLit( Gla_Man_t * p, int f )
{
    Gla_Obj_t * pFanin = Gla_ManObj( p, p->pObjRoot->Fanins[0] );
    int iSat = Vec_IntEntry( &pFanin->vFrames, f );
    assert( iSat > 0 );
    if ( f == 0 && pFanin->fRo && !p->pObjRoot->fCompl0 )
        return -1;
    return Abc_Var2Lit( iSat, p->pObjRoot->fCompl0 );
}